

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cted_tree_index_impl.h
# Opt level: O0

double __thiscall
ted_ub::CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>::ted
          (CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
           *this,TreeIndexSCTED *t1,TreeIndexSCTED *t2)

{
  pointer *this_00;
  UnitCostModelLD<label::StringLabel> *pUVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  size_type col;
  double dVar9;
  double dVar10;
  double local_470;
  double local_468;
  double local_460;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_398;
  double local_390;
  double local_388;
  uint local_164;
  uint local_160;
  uint t_1;
  uint s_1;
  uint t;
  uint s;
  int j_1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_148;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_140;
  double local_138;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_130;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_128;
  int local_11c;
  uint local_118;
  int i_1;
  uint k_1;
  int j;
  uint k;
  int i;
  double c;
  double b;
  double a;
  undefined1 local_e8 [8];
  vector<double,_std::allocator<double>_> df2;
  allocator<double> local_b9;
  undefined1 local_b8 [8];
  vector<double,_std::allocator<double>_> dt2;
  Matrix<double> local_78;
  Matrix<double> local_50;
  int local_28;
  int local_24;
  int t2_input_size;
  int t1_input_size;
  TreeIndexSCTED *t2_local;
  TreeIndexSCTED *t1_local;
  CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED> *this_local;
  
  (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>).
  subproblem_counter_ = 0;
  local_24 = (t1->super_Constants).tree_size_;
  local_28 = (t2->super_Constants).tree_size_;
  _t2_input_size = t2;
  t2_local = t1;
  t1_local = (TreeIndexSCTED *)this;
  data_structures::Matrix<double>::Matrix(&local_50,(long)(local_24 + 1),(long)(local_28 + 1));
  data_structures::Matrix<double>::operator=(&this->dt_,&local_50);
  data_structures::Matrix<double>::~Matrix(&local_50);
  data_structures::Matrix<double>::Matrix(&local_78,(long)(local_24 + 1),(long)(local_28 + 1));
  data_structures::Matrix<double>::operator=(&this->df_,&local_78);
  data_structures::Matrix<double>::~Matrix(&local_78);
  this_00 = &dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  data_structures::Matrix<double>::Matrix
            ((Matrix<double> *)this_00,(long)(local_24 + 1),(long)(local_28 + 1));
  data_structures::Matrix<double>::operator=(&this->e_,(Matrix<double> *)this_00);
  data_structures::Matrix<double>::~Matrix((Matrix<double> *)this_00);
  dVar9 = std::numeric_limits<double>::infinity();
  data_structures::Matrix<double>::fill_with(&this->dt_,dVar9);
  dVar9 = std::numeric_limits<double>::infinity();
  data_structures::Matrix<double>::fill_with(&this->df_,dVar9);
  dVar9 = std::numeric_limits<double>::infinity();
  data_structures::Matrix<double>::fill_with(&this->e_,dVar9);
  iVar2 = local_28 + 1;
  std::allocator<double>::allocator(&local_b9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b8,(long)iVar2,&local_b9);
  std::allocator<double>::~allocator(&local_b9);
  iVar2 = local_28 + 1;
  std::allocator<double>::allocator((allocator<double> *)((long)&a + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_e8,(long)iVar2,
             (allocator<double> *)((long)&a + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&a + 7));
  b = -1.0;
  c = -1.0;
  _k = -1.0;
  pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,0);
  *pdVar3 = 0.0;
  pdVar3 = data_structures::Matrix<double>::at(&this->df_,0,0);
  *pdVar3 = 0.0;
  for (j = 1; j <= local_24; j = j + 1) {
    pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)j,0);
    *pdVar3 = 0.0;
    k_1 = 1;
    while( true ) {
      uVar4 = (ulong)k_1;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,(long)(j + -1));
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
      if (sVar6 < uVar4) break;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,(long)(j + -1));
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(k_1 - 1));
      pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)(*pvVar7 + 1),0);
      dVar9 = *pdVar3;
      pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)j,0);
      *pdVar3 = dVar9 + *pdVar3;
      k_1 = k_1 + 1;
    }
    pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)j,0);
    dVar9 = *pdVar3;
    pUVar1 = (this->
             super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
             ).c_;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)(j + -1));
    dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar1,*pvVar7);
    pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)j,0);
    *pdVar3 = dVar9 + dVar10;
  }
  for (i_1 = 1; i_1 <= local_28; i_1 = i_1 + 1) {
    pdVar3 = data_structures::Matrix<double>::at(&this->df_,0,(long)i_1);
    *pdVar3 = 0.0;
    local_118 = 1;
    while( true ) {
      uVar4 = (ulong)local_118;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                            (long)(i_1 + -1));
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
      if (sVar6 < uVar4) break;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                            (long)(i_1 + -1));
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(local_118 - 1));
      pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,(long)(*pvVar7 + 1));
      dVar9 = *pdVar3;
      pdVar3 = data_structures::Matrix<double>::at(&this->df_,0,(long)i_1);
      *pdVar3 = dVar9 + *pdVar3;
      local_118 = local_118 + 1;
    }
    pdVar3 = data_structures::Matrix<double>::at(&this->df_,0,(long)i_1);
    dVar9 = *pdVar3;
    pUVar1 = (this->
             super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
             ).c_;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(_t2_input_size->super_PostLToLabelId).postl_to_label_id_,(long)(i_1 + -1))
    ;
    dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar1,*pvVar7);
    pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,(long)i_1);
    *pdVar3 = dVar9 + dVar10;
  }
  for (local_11c = 1; local_11c <= local_24; local_11c = local_11c + 1) {
    local_128._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_b8);
    local_130._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)local_b8);
    local_138 = std::numeric_limits<double>::infinity();
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (local_128,local_130,&local_138);
    local_140._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_e8);
    local_148._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)local_e8);
    _s = std::numeric_limits<double>::infinity();
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (local_140,local_148,(double *)&s);
    for (t = 1; (int)t <= local_28; t = t + 1) {
      pdVar3 = data_structures::Matrix<double>::at(&this->e_,0,0);
      *pdVar3 = 0.0;
      s_1 = 1;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,
                              (long)(local_11c + -1));
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
        if (sVar6 < s_1) break;
        pdVar3 = data_structures::Matrix<double>::at(&this->e_,(ulong)(s_1 - 1),0);
        dVar9 = *pdVar3;
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,
                              (long)(local_11c + -1));
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(s_1 - 1));
        pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)(*pvVar7 + 1),0);
        dVar10 = *pdVar3;
        pdVar3 = data_structures::Matrix<double>::at(&this->e_,(ulong)s_1,0);
        *pdVar3 = dVar9 + dVar10;
        s_1 = s_1 + 1;
      }
      t_1 = 1;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                              (long)(int)(t - 1));
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
        if (sVar6 < t_1) break;
        pdVar3 = data_structures::Matrix<double>::at(&this->e_,0,(ulong)(t_1 - 1));
        dVar9 = *pdVar3;
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                              (long)(int)(t - 1));
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(t_1 - 1));
        pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,(long)(*pvVar7 + 1));
        dVar10 = *pdVar3;
        pdVar3 = data_structures::Matrix<double>::at(&this->e_,0,(ulong)t_1);
        *pdVar3 = dVar9 + dVar10;
        t_1 = t_1 + 1;
      }
      local_160 = 1;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,
                              (long)(local_11c + -1));
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
        if (sVar6 < local_160) break;
        local_164 = 1;
        while( true ) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                (long)(int)(t - 1));
          sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
          if (sVar6 < local_164) break;
          (this->
          super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>)
          .subproblem_counter_ =
               (this->
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
               ).subproblem_counter_ + 1;
          pdVar3 = data_structures::Matrix<double>::at
                             (&this->e_,(ulong)local_160,(ulong)(local_164 - 1));
          dVar9 = *pdVar3;
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                (long)(int)(t - 1));
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(local_164 - 1))
          ;
          pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,(long)(*pvVar7 + 1));
          b = dVar9 + *pdVar3;
          pdVar3 = data_structures::Matrix<double>::at
                             (&this->e_,(ulong)(local_160 - 1),(ulong)local_164);
          dVar9 = *pdVar3;
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,
                                (long)(local_11c + -1));
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(local_160 - 1))
          ;
          pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)(*pvVar7 + 1),0);
          c = dVar9 + *pdVar3;
          pdVar3 = data_structures::Matrix<double>::at
                             (&this->e_,(ulong)(local_160 - 1),(ulong)(local_164 - 1));
          dVar9 = *pdVar3;
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,
                                (long)(local_11c + -1));
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(local_160 - 1))
          ;
          iVar2 = *pvVar7;
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                                (long)(int)(t - 1));
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)(local_164 - 1))
          ;
          pdVar3 = data_structures::Matrix<double>::at
                             (&this->dt_,(long)(iVar2 + 1),(long)(*pvVar7 + 1));
          _k = dVar9 + *pdVar3;
          if (b < c) {
            local_398 = _k;
            if (b < _k) {
              local_398 = b;
            }
            local_390 = local_398;
          }
          else {
            local_388 = _k;
            if (c < _k) {
              local_388 = c;
            }
            local_390 = local_388;
          }
          pdVar3 = data_structures::Matrix<double>::at(&this->e_,(ulong)local_160,(ulong)local_164);
          *pdVar3 = local_390;
          local_164 = local_164 + 1;
        }
        local_160 = local_160 + 1;
      }
      pdVar3 = data_structures::Matrix<double>::at(&this->df_,0,(long)(int)t);
      dVar9 = *pdVar3;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_e8,(long)(int)t);
      b = dVar9 + *pvVar8;
      pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,0);
      dVar9 = *pdVar3;
      pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,(long)(int)t);
      c = dVar9 + *pdVar3;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(t2_local->super_PostLToChildren).postl_to_children_,
                            (long)(local_11c + -1));
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(_t2_input_size->super_PostLToChildren).postl_to_children_,
                            (long)(int)(t - 1));
      col = std::vector<int,_std::allocator<int>_>::size(pvVar5);
      pdVar3 = data_structures::Matrix<double>::at(&this->e_,sVar6,col);
      _k = *pdVar3;
      if (b < c) {
        local_400 = _k;
        if (b < _k) {
          local_400 = b;
        }
        local_3f8 = local_400;
      }
      else {
        local_3f0 = _k;
        if (c < _k) {
          local_3f0 = c;
        }
        local_3f8 = local_3f0;
      }
      pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,(long)(int)t);
      *pdVar3 = local_3f8;
      pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,(long)(int)t);
      dVar9 = *pdVar3;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_b8,(long)(int)t);
      b = dVar9 + *pvVar8;
      pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,0);
      dVar9 = *pdVar3;
      pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,(long)(int)t);
      c = dVar9 + *pdVar3;
      pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,(long)(int)t);
      dVar9 = *pdVar3;
      pUVar1 = (this->
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
               ).c_;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToLabelId).postl_to_label_id_,
                          (long)(local_11c + -1));
      iVar2 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(_t2_input_size->super_PostLToLabelId).postl_to_label_id_,
                          (long)(int)(t - 1));
      _k = cost_model::UnitCostModelLD<label::StringLabel>::ren(pUVar1,iVar2,*pvVar7);
      _k = dVar9 + _k;
      if (b < c) {
        local_470 = _k;
        if (b < _k) {
          local_470 = b;
        }
        local_468 = local_470;
      }
      else {
        local_460 = _k;
        if (c < _k) {
          local_460 = c;
        }
        local_468 = local_460;
      }
      pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,(long)(int)t);
      *pdVar3 = local_468;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(_t2_input_size->super_PostLToParent).postl_to_parent_,(long)(int)(t - 1)
                         );
      if (-1 < *pvVar7) {
        pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,(long)(int)t);
        dVar9 = *pdVar3;
        pdVar3 = data_structures::Matrix<double>::at(&this->df_,0,(long)(int)t);
        dVar10 = *pdVar3;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(_t2_input_size->super_PostLToParent).postl_to_parent_,
                            (long)(int)(t - 1));
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_e8,(long)(*pvVar7 + 1))
        ;
        if (dVar9 - dVar10 < *pvVar8) {
          pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,(long)(int)t);
          dVar9 = *pdVar3;
          pdVar3 = data_structures::Matrix<double>::at(&this->df_,0,(long)(int)t);
          dVar10 = *pdVar3;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(_t2_input_size->super_PostLToParent).postl_to_parent_,
                              (long)(int)(t - 1));
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_e8,
                              (long)(*pvVar7 + 1));
          *pvVar8 = dVar9 - dVar10;
        }
        pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,(long)(int)t);
        dVar9 = *pdVar3;
        pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,(long)(int)t);
        dVar10 = *pdVar3;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(_t2_input_size->super_PostLToParent).postl_to_parent_,
                            (long)(int)(t - 1));
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_b8,(long)(*pvVar7 + 1))
        ;
        if (dVar9 - dVar10 < *pvVar8) {
          pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,(long)(int)t);
          dVar9 = *pdVar3;
          pdVar3 = data_structures::Matrix<double>::at(&this->dt_,0,(long)(int)t);
          dVar10 = *pdVar3;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(_t2_input_size->super_PostLToParent).postl_to_parent_,
                              (long)(int)(t - 1));
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_b8,
                              (long)(*pvVar7 + 1));
          *pvVar8 = dVar9 - dVar10;
        }
      }
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(local_11c + -1));
      if (-1 < *pvVar7) {
        pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,(long)(int)t);
        dVar9 = *pdVar3;
        pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,0);
        dVar10 = *pdVar3;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(local_11c + -1)
                           );
        pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)(*pvVar7 + 1),(long)(int)t);
        if (dVar9 - dVar10 < *pdVar3) {
          pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,(long)(int)t);
          dVar9 = *pdVar3;
          pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)local_11c,0);
          dVar10 = *pdVar3;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToParent).postl_to_parent_,
                              (long)(local_11c + -1));
          pdVar3 = data_structures::Matrix<double>::at(&this->df_,(long)(*pvVar7 + 1),(long)(int)t);
          *pdVar3 = dVar9 - dVar10;
        }
        pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,(long)(int)t);
        dVar9 = *pdVar3;
        pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,0);
        dVar10 = *pdVar3;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToParent).postl_to_parent_,(long)(local_11c + -1)
                           );
        pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)(*pvVar7 + 1),(long)(int)t);
        if (dVar9 - dVar10 < *pdVar3) {
          pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,(long)(int)t);
          dVar9 = *pdVar3;
          pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_11c,0);
          dVar10 = *pdVar3;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToParent).postl_to_parent_,
                              (long)(local_11c + -1));
          pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)(*pvVar7 + 1),(long)(int)t);
          *pdVar3 = dVar9 - dVar10;
        }
      }
    }
  }
  pdVar3 = data_structures::Matrix<double>::at(&this->dt_,(long)local_24,(long)local_28);
  dVar9 = *pdVar3;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_e8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_b8);
  return dVar9;
}

Assistant:

double CTEDTreeIndex<CostModel, TreeIndex>::ted(const TreeIndex& t1, const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  
  // Initialise distance matrices.
  
  // TODO: Verify if a move assignment operator is used here.
  dt_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e_.fill_with(std::numeric_limits<double>::infinity());
  
  std::vector<double> dt2(t2_input_size + 1);
  std::vector<double> df2(t2_input_size + 1);
  
  double a = -1;
  double b = -1;
  double c = -1;
  
  dt_.at(0, 0) = 0;
  df_.at(0, 0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    df_.at(i, 0) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      df_.at(i, 0) += dt_.at(t1.postl_to_children_[i-1][k-1] + 1, 0);
    }
    dt_.at(i, 0) = df_.at(i, 0) + c_.del(t1.postl_to_label_id_[i - 1]);
  }
  for (int j = 1; j <= t2_input_size; ++j) {
    df_.at(0, j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      df_.at(0, j) += dt_.at(0, t2.postl_to_children_[j-1][k-1] + 1);
    }
    dt_.at(0, j) = df_.at(0, j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  for (int i = 1; i <= t1_input_size; ++i) {
    std::fill(dt2.begin(), dt2.end(), std::numeric_limits<double>::infinity());
    std::fill(df2.begin(), df2.end(), std::numeric_limits<double>::infinity());
    
    for (int j = 1; j <= t2_input_size; ++j) {
      e_.at(0, 0) = 0;
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        e_.at(s, 0) = e_.at(s-1, 0) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0); // here we access d for subtree rooted in the s'th child of node i AND s starts with 1 but the postorder of the first child of node i is children1[i][s-1]
      }
      for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
        e_.at(0, t) = e_.at(0, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
      }
      
      // TODO: but we already went over each pair of children
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
          ++subproblem_counter_;
          a = e_.at(s, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
          b = e_.at(s-1, t) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0);
          c = e_.at(s-1, t-1) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, t2.postl_to_children_[j-1][t-1] + 1); // TODO: This is a problematic part to reduce the memory. This requires to store distance for each pair of children of i and j.
          e_.at(s, t) = a >= b ? b >= c ? c : b : a >= c ? c : a;
        }
      }
      
      a = df_.at(0, j) + df2[j];
      b = df_.at(i, 0) + df_.at(i, j);
      c = e_.at(t1.postl_to_children_[i-1].size(), t2.postl_to_children_[j-1].size());
      
      df_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      a = dt_.at(0, j) + dt2[j];
      b = dt_.at(i, 0) + dt_.at(i, j);
      c = df_.at(i, j) + c_.ren(t1.postl_to_label_id_[i - 1], t2.postl_to_label_id_[j - 1]);
      
      dt_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      if (t2.postl_to_parent_[j-1] > -1) {
        if (df_.at(i, j) - df_.at(0, j) < df2[t2.postl_to_parent_[j-1]+1]) {
          df2[t2.postl_to_parent_[j-1]+1] = df_.at(i, j) - df_.at(0, j);
        }
        if (dt_.at(i, j) - dt_.at(0, j) < dt2[t2.postl_to_parent_[j-1]+1]) {
          dt2[t2.postl_to_parent_[j-1]+1] = dt_.at(i, j) - dt_.at(0, j);
        }
      }
      if (t1.postl_to_parent_[i-1] > -1) {
        if (df_.at(i, j) - df_.at(i, 0) < df_.at(t1.postl_to_parent_[i-1]+1, j)) {
          df_.at(t1.postl_to_parent_[i-1]+1, j) = df_.at(i, j) - df_.at(i, 0);
        }
        if (dt_.at(i, j) - dt_.at(i, 0) < dt_.at(t1.postl_to_parent_[i-1]+1, j)) {
          dt_.at(t1.postl_to_parent_[i-1]+1, j) = dt_.at(i, j) - dt_.at(i, 0);
        }
      }
    }
  }

  return dt_.at(t1_input_size, t2_input_size);
}